

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

png_alloc_size_t png_image_size(png_structrp png_ptr)

{
  byte bVar1;
  uint uVar2;
  png_alloc_size_t pVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar2 = png_ptr->height;
  pVar3 = 0xffffffff;
  if (uVar2 < 0x8000 && png_ptr->rowbytes < 0x8000) {
    if (png_ptr->interlaced != '\0') {
      bVar1 = png_ptr->pixel_depth;
      uVar6 = 7;
      uVar7 = 1;
      pVar3 = 0;
      do {
        uVar5 = uVar7 - 1;
        bVar4 = (byte)(uVar6 >> 1);
        if (uVar5 < 2) {
          bVar4 = 3;
        }
        uVar8 = (~(-1 << (bVar4 & 0x1f)) + png_ptr->width) -
                ((uVar5 & 1) << (3U - (char)(uVar7 >> 1) & 0x1f) & 7);
        if (uVar8 >> (bVar4 & 0x1f) != 0) {
          uVar9 = (ulong)(uVar8 >> (bVar4 & 0x1f));
          if (bVar1 < 8) {
            uVar9 = uVar9 * bVar1 + 7 >> 3;
          }
          else {
            uVar9 = uVar9 * (bVar1 >> 3);
          }
          bVar4 = (byte)(uVar6 + 1 >> 1);
          if (uVar5 < 3) {
            bVar4 = 3;
          }
          pVar3 = pVar3 + (ulong)((uVar2 - ((uVar5 & 1 ^ 1) << (3U - (char)(uVar5 >> 1) & 0x1f) & 7)
                                  ) + ~(-1 << (bVar4 & 0x1f)) >> (bVar4 & 0x1f)) * (uVar9 + 1);
        }
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      return pVar3;
    }
    pVar3 = (png_ptr->rowbytes + 1) * (ulong)uVar2;
  }
  return pVar3;
}

Assistant:

static png_alloc_size_t
png_image_size(png_structrp png_ptr)
{
   /* Only return sizes up to the maximum of a png_uint_32; do this by limiting
    * the width and height used to 15 bits.
    */
   png_uint_32 h = png_ptr->height;

   if (png_ptr->rowbytes < 32768 && h < 32768)
   {
      if (png_ptr->interlaced != 0)
      {
         /* Interlacing makes the image larger because of the replication of
          * both the filter byte and the padding to a byte boundary.
          */
         png_uint_32 w = png_ptr->width;
         unsigned int pd = png_ptr->pixel_depth;
         png_alloc_size_t cb_base;
         int pass;

         for (cb_base=0, pass=0; pass<=6; ++pass)
         {
            png_uint_32 pw = PNG_PASS_COLS(w, pass);

            if (pw > 0)
               cb_base += (PNG_ROWBYTES(pd, pw)+1) * PNG_PASS_ROWS(h, pass);
         }

         return cb_base;
      }

      else
         return (png_ptr->rowbytes+1) * h;
   }

   else
      return 0xffffffffU;
}